

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O2

void __thiscall QGraphicsWidget::~QGraphicsWidget(QGraphicsWidget *this)

{
  QArrayDataPointer<QGraphicsItem_*> *this_00;
  long lVar1;
  long *plVar2;
  QGraphicsItem **ppQVar3;
  bool bVar4;
  QGraphicsScene *pQVar5;
  QGraphicsLayoutItem *pQVar6;
  Type *this_01;
  QGraphicsWidget *pQVar7;
  QArrayDataPointer<QGraphicsItem_*> *this_02;
  long lVar8;
  long lVar9;
  QGraphicsItem *pQVar10;
  long lVar11;
  long in_FS_OFFSET;
  QGraphicsLayout *temp;
  QArrayDataPointer<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_007eeb50;
  this_00 = (QArrayDataPointer<QGraphicsItem_*> *)(this + 0x10);
  *(undefined ***)(this + 0x10) = &PTR__QGraphicsWidget_007eecb8;
  *(undefined ***)(this + 0x20) = &PTR__QGraphicsWidget_007eedf0;
  lVar1 = *(long *)(this + 0x18);
  lVar8 = *(long *)(lVar1 + 0x1f8);
  lVar11 = *(long *)(lVar1 + 0x200);
  for (lVar9 = 0; lVar11 << 3 != lVar9; lVar9 = lVar9 + 8) {
    local_58.d = (Data *)this;
    QtPrivate::sequential_erase_with_copy<QList<QObject*>,QGraphicsWidget*>
              ((QList<QObject_*> *)(*(long *)(*(long *)(lVar8 + lVar9) + 8) + 0x140),
               (QWindow **)&local_58);
  }
  QList<QAction_*>::clear((QList<QAction_*> *)(lVar1 + 0x1f0));
  pQVar5 = QGraphicsItem::scene((QGraphicsItem *)this_00);
  if ((pQVar5 != (QGraphicsScene *)0x0) &&
     (*(QGraphicsWidget **)(*(long *)&pQVar5->field_0x8 + 0x1a0) == this)) {
    pQVar7 = (QGraphicsWidget *)0x0;
    if (*(QGraphicsWidget **)(lVar1 + 0x1c0) != this) {
      pQVar7 = *(QGraphicsWidget **)(lVar1 + 0x1c0);
    }
    *(QGraphicsWidget **)(*(long *)&pQVar5->field_0x8 + 0x1a0) = pQVar7;
  }
  lVar8 = *(long *)(lVar1 + 0x1c0);
  lVar11 = *(long *)(lVar1 + 0x1c8);
  *(long *)(*(long *)(lVar11 + 0x18) + 0x1c0) = lVar8;
  *(long *)(*(long *)(lVar8 + 0x18) + 0x1c8) = lVar11;
  *(QGraphicsWidget **)(lVar1 + 0x1c0) = this;
  *(QGraphicsWidget **)(lVar1 + 0x1c8) = this;
  this_02 = this_00;
  QGraphicsItem::clearFocus((QGraphicsItem *)this_00);
  plVar2 = *(long **)(lVar1 + 0x180);
  if (plVar2 != (long *)0x0) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    QGraphicsItem::childItems((QList<QGraphicsItem_*> *)&local_58,(QGraphicsItem *)this_00);
    ppQVar3 = local_58.ptr;
    lVar11 = local_58.size << 3;
    for (lVar8 = 0; lVar11 != lVar8; lVar8 = lVar8 + 8) {
      pQVar10 = *(QGraphicsItem **)((long)ppQVar3 + lVar8);
      bVar4 = QGraphicsItem::isWidget(pQVar10);
      if (bVar4) {
        pQVar10 = pQVar10 + 1;
        pQVar6 = QGraphicsLayoutItem::parentLayoutItem((QGraphicsLayoutItem *)pQVar10);
        if (pQVar6 == *(QGraphicsLayoutItem **)(lVar1 + 0x180)) {
          QGraphicsLayoutItem::setParentLayoutItem
                    ((QGraphicsLayoutItem *)pQVar10,(QGraphicsLayoutItem *)0x0);
        }
      }
    }
    *(undefined8 *)(lVar1 + 0x180) = 0;
    (**(code **)(*plVar2 + 8))();
    this_02 = &local_58;
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(this_02);
  }
  this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_widgetStyles>_>::
            operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_widgetStyles>_>
                        *)this_02);
  QGraphicsWidgetStyles::setStyleForWidget(this_01,(QWindow *)this,(QStyle *)0x0);
  QGraphicsItem::setParentItem((QGraphicsItem *)this_00,(QGraphicsItem *)0x0);
  QGraphicsLayoutItem::~QGraphicsLayoutItem((QGraphicsLayoutItem *)(this + 0x20));
  QGraphicsObject::~QGraphicsObject((QGraphicsObject *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsWidget::~QGraphicsWidget()
{
    Q_D(QGraphicsWidget);
#ifndef QT_NO_ACTION
    // Remove all actions from this widget
    for (auto action : std::as_const(d->actions)) {
        QActionPrivate *apriv = action->d_func();
        apriv->associatedObjects.removeAll(this);
    }
    d->actions.clear();
#endif

    if (QGraphicsScene *scn = scene()) {
        QGraphicsScenePrivate *sceneD = scn->d_func();
        if (sceneD->tabFocusFirst == this)
            sceneD->tabFocusFirst = (d->focusNext == this ? nullptr : d->focusNext);
    }
    d->focusPrev->d_func()->focusNext = d->focusNext;
    d->focusNext->d_func()->focusPrev = d->focusPrev;

    // Play it really safe
    d->focusNext = this;
    d->focusPrev = this;

    clearFocus();

    //we check if we have a layout previously
    if (d->layout) {
        QGraphicsLayout *temp = d->layout;
        const auto items = childItems();
        for (QGraphicsItem *item : items) {
            // In case of a custom layout which doesn't remove and delete items, we ensure that
            // the parent layout item does not point to the deleted layout. This code is here to
            // avoid regression from 4.4 to 4.5, because according to 4.5 docs it is not really needed.
            if (item->isWidget()) {
                QGraphicsWidget *widget = static_cast<QGraphicsWidget *>(item);
                if (widget->parentLayoutItem() == d->layout)
                    widget->setParentLayoutItem(nullptr);
            }
        }
        d->layout = nullptr;
        delete temp;
    }

    // Remove this graphics widget from widgetStyles
    widgetStyles()->setStyleForWidget(this, nullptr);

    // Unset the parent here, when we're still a QGraphicsWidget.
    // It is otherwise done in ~QGraphicsItem() where we'd be
    // calling QGraphicsWidget members on an ex-QGraphicsWidget object
    setParentItem(nullptr);
}